

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall KDIS::NETWORK::Connection::SetBlockingModeEnabled(Connection *this,KBOOL E)

{
  KException *this_00;
  int *piVar1;
  KCHAR8 *__s;
  allocator<char> local_41;
  KString local_40;
  uint local_1c;
  int local_18;
  KINT32 uliIoctBlock;
  KINT32 iResult;
  KINT8 i;
  KBOOL E_local;
  Connection *this_local;
  
  this->m_bBlockingSocket = E;
  uliIoctBlock._2_1_ = '\0';
  uliIoctBlock._3_1_ = E;
  _iResult = this;
  while( true ) {
    if ('\x01' < uliIoctBlock._2_1_) {
      return;
    }
    local_1c = (uint)((this->m_bBlockingSocket ^ 0xffU) & 1);
    local_18 = fcntl(this->m_iSocket[uliIoctBlock._2_1_],4,0x2800,&local_1c);
    if (local_18 == -1) break;
    uliIoctBlock._2_1_ = uliIoctBlock._2_1_ + '\x01';
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  piVar1 = __errno_location();
  __s = getErrorText(this,*piVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  KException::KException(this_00,&local_40,0xc);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Connection::SetBlockingModeEnabled( KBOOL E )
{
    m_bBlockingSocket = E;

    for( KINT8 i = 0; i < 2; ++i )
    {
        KINT32 iResult;

#if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )

        // Windows non blocking //
        unsigned long int uliIoctBlock = !m_bBlockingSocket;           // 1 enable, 0 disable.
        iResult = ioctlsocket( m_iSocket[i], FIONBIO, &uliIoctBlock ); // FIONBIO =  blocking mode

#else

        // Linux non blocking //
        KINT32 uliIoctBlock = !m_bBlockingSocket; // 1 enable, 0 disable.
        iResult = fcntl( m_iSocket[i], F_SETFL, O_NONBLOCK | FASYNC, &uliIoctBlock );

#endif

        if( iResult == SOCKET_ERROR )
        {
            THROW_ERROR;
        }
    }
}